

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

int rank(double *A,int M,int N)

{
  int iVar1;
  double *col;
  
  col = (double *)malloc((long)M * (long)N * 8);
  iVar1 = M;
  if (M < N) {
    mtranspose(A,M,N,col);
    A = col;
    iVar1 = N;
    N = M;
  }
  iVar1 = rank_c(A,iVar1,N);
  free(col);
  return iVar1;
}

Assistant:

int rank(double *A, int M,int N) {
	int rnk;
	double *AT;

	AT = (double*) malloc(sizeof(double) * M*N);

	if (M < N) {
		mtranspose(A,M,N,AT);
		rnk = rank_c(AT,N,M);
	} else {
		rnk = rank_c(A,M,N);
	}

	free(AT);
	return rnk;

}